

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall QFutureInterfaceBase::waitForResume(QFutureInterfaceBase *this)

{
  long lVar1;
  void *__stat_loc;
  uint uVar2;
  long in_RDI;
  long in_FS_OFFSET;
  int state;
  int state_1;
  ThreadPoolThreadReleaser releaser;
  QMutexLocker<QMutex> lock;
  TimerType in_stack_ffffffffffffff78;
  ForeverConstant in_stack_ffffffffffffff7c;
  QFutureInterfaceBasePrivate *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x6dcd6b);
  if (((uVar2 & 0x30) != 0) && ((uVar2 & 8) == 0)) {
    QMutexLocker<QMutex>::QMutexLocker
              ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80,
               (QMutex *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    uVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x6dcdcc);
    if (((uVar2 & 0x30) != 0) && ((uVar2 & 8) == 0)) {
      QFutureInterfaceBasePrivate::pool(in_stack_ffffffffffffff80);
      anon_unknown.dwarf_f2b43a::ThreadPoolThreadReleaser::ThreadPoolThreadReleaser
                ((ThreadPoolThreadReleaser *)in_stack_ffffffffffffff80,
                 (QThreadPool *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      __stat_loc = *(void **)(in_RDI + 8);
      QDeadlineTimer::QDeadlineTimer
                ((QDeadlineTimer *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                 in_stack_ffffffffffffff78);
      QWaitCondition::wait((QWaitCondition *)((long)__stat_loc + 0x40),__stat_loc);
      anon_unknown.dwarf_f2b43a::ThreadPoolThreadReleaser::~ThreadPoolThreadReleaser
                ((ThreadPoolThreadReleaser *)in_stack_ffffffffffffff80);
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::waitForResume()
{
    // return early if possible to avoid taking the mutex lock.
    {
        const int state = d->state.loadRelaxed();
        if (!(state & suspendingOrSuspended) || (state & Canceled))
            return;
    }

    QMutexLocker lock(&d->m_mutex);
    const int state = d->state.loadRelaxed();
    if (!(state & suspendingOrSuspended) || (state & Canceled))
        return;

    // decrease active thread count since this thread will wait.
    const ThreadPoolThreadReleaser releaser(d->pool());

    d->pausedWaitCondition.wait(&d->m_mutex);
}